

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

Index wasm::Properties::getSignExtBits(Expression *curr)

{
  bool bVar1;
  Index IVar2;
  Unary *pUVar3;
  Binary *pBVar4;
  Expression *rightShift;
  Unary *unary;
  Expression *local_18;
  Expression *curr_local;
  
  unary._4_4_ = 2;
  local_18 = curr;
  bVar1 = wasm::Type::operator==(&curr->type,(BasicType *)((long)&unary + 4));
  if (!bVar1) {
    __assert_fail("curr->type == Type::i32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                  ,0xb3,"Index wasm::Properties::getSignExtBits(Expression *)");
  }
  pUVar3 = Expression::dynCast<wasm::Unary>(local_18);
  if (pUVar3 == (Unary *)0x0) {
    pBVar4 = Expression::cast<wasm::Binary>(local_18);
    IVar2 = Bits::getEffectiveShifts(pBVar4->right);
    curr_local._4_4_ = 0x20 - IVar2;
  }
  else if (pUVar3->op == ExtendS8Int32) {
    curr_local._4_4_ = 8;
  }
  else {
    if (pUVar3->op != ExtendS16Int32) {
      handle_unreachable("invalid unary operation",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/properties.h"
                         ,0xbb);
    }
    curr_local._4_4_ = 0x10;
  }
  return curr_local._4_4_;
}

Assistant:

inline Index getSignExtBits(Expression* curr) {
  assert(curr->type == Type::i32);
  if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ExtendS8Int32:
        return 8;
      case ExtendS16Int32:
        return 16;
      default:
        WASM_UNREACHABLE("invalid unary operation");
    }
  } else {
    auto* rightShift = curr->cast<Binary>()->right;
    return 32 - Bits::getEffectiveShifts(rightShift);
  }
}